

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseClosingXMLElement
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  unsigned_long *puVar1;
  int iVar2;
  unsigned_long *c;
  unsigned_long *puVar3;
  string<unsigned_long> local_30;
  
  this->CurrentNodeType = EXN_ELEMENT_END;
  this->IsEmptyElement = false;
  core::array<irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::SAttribute>::clear
            (&this->Attributes);
  c = this->P + 1;
  puVar1 = c;
  do {
    puVar3 = puVar1;
    this->P = puVar3;
    puVar1 = puVar3 + 1;
  } while (*puVar3 != 0x3e);
  iVar2 = isspace((int)puVar3[-1]);
  while (iVar2 != 0) {
    this->P = puVar3 + -1;
    iVar2 = isspace((int)puVar3[-2]);
    puVar3 = puVar3 + -1;
  }
  core::string<unsigned_long>::string<unsigned_long>
            (&local_30,c,(s32)((ulong)((long)puVar3 - (long)c) >> 3));
  core::string<unsigned_long>::operator=(&this->NodeName,&local_30);
  if (local_30.array != (unsigned_long *)0x0) {
    operator_delete__(local_30.array);
  }
  this->P = this->P + 1;
  return;
}

Assistant:

void parseClosingXMLElement()
	{
		CurrentNodeType = EXN_ELEMENT_END;
		IsEmptyElement = false;
		Attributes.clear();

		++P;
		const char_type* pBeginClose = P;

		while(*P != L'>')
			++P;

    // remove trailing whitespace, if any
    while( std::isspace( P[-1]))
      --P;

		NodeName = core::string<char_type>(pBeginClose, (int)(P - pBeginClose));
		++P;
	}